

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int local_154;
  int high;
  int overflow;
  secp256k1_scalar n;
  secp256k1_ge r;
  secp256k1_gej rp;
  uchar b [32];
  secp256k1_scalar *nonce_local;
  secp256k1_scalar *message_local;
  secp256k1_scalar *seckey_local;
  secp256k1_scalar *sigs_local;
  secp256k1_scalar *sigr_local;
  secp256k1_ecmult_gen_context *ctx_local;
  
  local_154 = 0;
  secp256k1_ecmult_gen(ctx,(secp256k1_gej *)&r.infinity,nonce);
  secp256k1_ge_set_gej((secp256k1_ge *)(n.d + 3),(secp256k1_gej *)&r.infinity);
  secp256k1_fe_normalize((secp256k1_fe *)(n.d + 3));
  secp256k1_fe_normalize((secp256k1_fe *)(r.x.n + 4));
  secp256k1_fe_get_b32((uchar *)&rp.infinity,(secp256k1_fe *)(n.d + 3));
  secp256k1_scalar_set_b32(sigr,(uchar *)&rp.infinity,&local_154);
  if (recid != (int *)0x0) {
    uVar1 = local_154 << 1;
    uVar2 = secp256k1_fe_is_odd((secp256k1_fe *)(r.x.n + 4));
    *recid = uVar1 | uVar2;
  }
  secp256k1_scalar_mul((secp256k1_scalar *)&high,sigr,seckey);
  secp256k1_scalar_add((secp256k1_scalar *)&high,(secp256k1_scalar *)&high,message);
  secp256k1_scalar_inverse(sigs,nonce);
  secp256k1_scalar_mul(sigs,sigs,(secp256k1_scalar *)&high);
  secp256k1_scalar_clear((secp256k1_scalar *)&high);
  secp256k1_gej_clear((secp256k1_gej *)&r.infinity);
  secp256k1_ge_clear((secp256k1_ge *)(n.d + 3));
  uVar1 = secp256k1_scalar_is_high(sigs);
  secp256k1_scalar_cond_negate(sigs,uVar1);
  if (recid != (int *)0x0) {
    *recid = uVar1 ^ *recid;
  }
  iVar3 = secp256k1_scalar_is_zero(sigr);
  iVar4 = secp256k1_scalar_is_zero(sigs);
  return (uint)((iVar3 != 0 ^ 0xffU) & 1 & (iVar4 != 0 ^ 0xffU) & 1);
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}